

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O3

void __thiscall D2xNvmFlash::erase(D2xNvmFlash *this,uint32_t offset,uint32_t size)

{
  uint uVar1;
  uint32_t uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = (this->super_Flash)._size * 4;
  uVar4 = (ulong)offset / (ulong)uVar5;
  if (offset % uVar5 == 0) {
    uVar1 = (*(this->super_Flash)._vptr_Flash[6])();
    if (size + offset <= uVar1) {
      uVar1 = (uint)uVar4;
      while (uVar1 < ((size + offset + uVar5) - 1) / uVar5) {
        do {
          uVar2 = Samba::readWord((this->super_Flash)._samba,0x41004014);
        } while ((uVar2 & 1) == 0);
        uVar2 = Samba::readWord((this->super_Flash)._samba,0x41004018);
        Samba::writeWord((this->super_Flash)._samba,0x41004018,uVar2 & 0xffff | 0xffeb);
        Samba::writeWord((this->super_Flash)._samba,0x4100401c,(int)uVar4 * uVar5 >> 1);
        command(this,'\x02');
        uVar1 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar1;
      }
      return;
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_00118778;
  __cxa_throw(puVar3,&FlashEraseError::typeinfo,std::exception::~exception);
}

Assistant:

void
D2xNvmFlash::erase(uint32_t offset, uint32_t size)
{
    uint32_t eraseSize = _size * ERASE_ROW_PAGES;

    // Offset must be a multiple of the erase size
    if (offset % eraseSize)
        throw FlashEraseError();

    // Offset and size must be in range
    if (offset + size > totalSize())
        throw FlashEraseError();

    uint32_t eraseEnd = (offset + size + eraseSize - 1) / eraseSize;

    // Erase each erase size set of pages
    for (uint32_t eraseNum = offset / eraseSize; eraseNum < eraseEnd; eraseNum++)
    {
        waitReady();

        // Clear error bits
        uint16_t statusReg = readReg(NVM_REG_STATUS);
        writeReg(NVM_REG_STATUS, statusReg | NVM_CTRL_STATUS_MASK);

        // Issue erase command
        uint32_t wordAddr = (eraseNum * eraseSize) / 2;
        writeReg(NVM_REG_ADDR, wordAddr);
        command(NVM_CMD_ER);
    }
}